

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeBrOn(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  BrOnOp BVar2;
  Nullability NVar3;
  value_type *ppEVar4;
  Type TVar5;
  Expression *pEVar6;
  BrOn *brOn;
  HeapType HVar7;
  Type type_00;
  int iVar8;
  TranslateToFuzzReader *this_00;
  Name name;
  undefined1 local_78 [8];
  anon_class_16_2_3fee0b3d fixFlowingType;
  Type type_local;
  Type local_58;
  Type local_50;
  uintptr_t local_48;
  TranslateToFuzzReader *local_40;
  Type local_38;
  Type castType;
  
  fixFlowingType.this = (TranslateToFuzzReader *)type.id;
  if ((this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_40 = (TranslateToFuzzReader *)&this->random;
    iVar8 = (this->fuzzParams->super_FuzzParams).TRIES + 1;
    local_48 = type.id;
    while (iVar8 = iVar8 + -1, type.id = local_48, 0 < iVar8) {
      this_00 = local_40;
      ppEVar4 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                          ((Random *)local_40,&this->funcContext->breakableStack);
      pEVar6 = *ppEVar4;
      name = getTargetName(this_00,pEVar6);
      TVar5 = getTargetType(this_00,pEVar6);
      fixFlowingType.type = (Type *)this;
      if (6 < TVar5.id && (TVar5.id & 1) == 0) {
        local_78 = (undefined1  [8])&fixFlowingType.this;
        type_local.id = TVar5.id;
        BVar2 = Random::pick<wasm::BrOnOp,wasm::BrOnOp,wasm::BrOnOp>
                          ((Random *)local_40,BrOnNonNull,BrOnCast,BrOnCastFail);
        local_38.id = 0;
        local_48 = CONCAT44(local_48._4_4_,BVar2);
        if (BVar2 == BrOnCastFail) {
          type_00 = getSubType(this,TVar5);
          local_58 = type_00;
          bVar1 = Random::oneIn((Random *)local_40,5);
          if (bVar1) {
            local_38 = getSuperType(this,type_00);
          }
          else {
            local_38 = getSubType(this,type_00);
          }
          if (((local_38.id & 3) == 0 && 6 < local_38.id) &&
             (bVar1 = Random::oneIn((Random *)local_40,2), bVar1)) {
            HVar7 = Type::getHeapType(&local_38);
            NVar3 = Nullable;
LAB_00162749:
            Type::Type(&local_50,HVar7,NVar3,Inexact);
            local_38.id = local_50.id;
          }
        }
        else if (BVar2 == BrOnCast) {
          local_38 = getSubType(this,TVar5);
          bVar1 = Random::oneIn((Random *)local_40,5);
          if (bVar1) {
            type_00 = getSubType(this,local_38);
          }
          else {
            type_00 = getSuperType(this,local_38);
          }
          local_58.id = type_00.id;
          if ((((TVar5.id & 2) == 0) && (type_00.id < 7 || (type_00.id & 3) != 0)) &&
             (local_38.id < 7 || (local_38.id & 3) != 0)) {
            bVar1 = Random::oneIn((Random *)local_40,2);
            if (!bVar1) {
              HVar7 = Type::getHeapType(&local_38);
              NVar3 = NonNullable;
              goto LAB_00162749;
            }
            HVar7 = Type::getHeapType(&local_58);
            Type::Type(&local_50,HVar7,NonNullable,Inexact);
            local_58.id = local_50.id;
            type_00.id = local_50.id;
          }
        }
        else {
          if (BVar2 != BrOnNonNull) {
            ::wasm::handle_unreachable
                      ("bad br_on op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                       ,0x1350);
          }
          HVar7 = Type::getHeapType(&type_local);
          NVar3 = getNullability(this);
          Type::Type(&local_50,HVar7,NVar3,Inexact);
          local_58.id = local_50.id;
          type_00.id = local_50.id;
        }
        pEVar6 = make(this,type_00);
        brOn = Builder::makeBrOn(&this->builder,(BrOnOp)local_48,name,pEVar6,local_38);
        goto LAB_00162786;
      }
      if (TVar5.id == 0) {
        type_local.id = 0;
        local_78 = (undefined1  [8])&fixFlowingType.this;
        TVar5 = getReferenceType(this);
        pEVar6 = make(this,TVar5);
        brOn = Builder::makeBrOn(&this->builder,BrOnNull,name,pEVar6,(Type)0x0);
LAB_00162786:
        pEVar6 = makeBrOn::anon_class_16_2_3fee0b3d::operator()
                           ((anon_class_16_2_3fee0b3d *)local_78,(Expression *)brOn);
        return pEVar6;
      }
    }
  }
  pEVar6 = makeTrivial(this,type);
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeBrOn(Type type) {
  if (funcContext->breakableStack.empty()) {
    return makeTrivial(type);
  }
  // We need to find a proper target to break to; try a few times. Finding the
  // target is harder than flowing out the proper type, so focus on the target,
  // and fix up the flowing type later. That is, once we find a target to break
  // to, we can then either drop ourselves or wrap ourselves in a block +
  // another value, so that we return the proper thing here (which is done below
  // in fixFlowingType).
  int tries = fuzzParams->TRIES;
  Name targetName;
  Type targetType;
  while (--tries >= 0) {
    auto* target = pick(funcContext->breakableStack);
    targetName = getTargetName(target);
    targetType = getTargetType(target);
    // We can send any reference type, or no value at all, but nothing else.
    if (targetType.isRef() || targetType == Type::none) {
      break;
    }
  }
  if (tries < 0) {
    return makeTrivial(type);
  }

  auto fixFlowingType = [&](Expression* brOn) -> Expression* {
    if (Type::isSubType(brOn->type, type)) {
      // Already of the proper type.
      return brOn;
    }
    if (type == Type::none) {
      // We just need to drop whatever it is.
      return builder.makeDrop(brOn);
    }
    // We need to replace the type with something else. Drop the BrOn if we need
    // to, and append a value with the proper type.
    if (brOn->type != Type::none) {
      brOn = builder.makeDrop(brOn);
    }
    return builder.makeSequence(brOn, make(type));
  };

  // We found something to break to. Figure out which BrOn variants we can
  // send.
  if (targetType == Type::none) {
    // BrOnNull is the only variant that sends no value.
    return fixFlowingType(
      builder.makeBrOn(BrOnNull, targetName, make(getReferenceType())));
  }

  // We are sending a reference type to the target. All other BrOn variants can
  // do that.
  assert(targetType.isRef());
  auto op = pick(BrOnNonNull, BrOnCast, BrOnCastFail);
  Type castType = Type::none;
  Type refType;
  switch (op) {
    case BrOnNonNull: {
      // The sent type is the non-nullable version of the reference, so any ref
      // of that type is ok, nullable or not.
      refType = Type(targetType.getHeapType(), getNullability());
      break;
    }
    case BrOnCast: {
      // The sent type is the heap type we cast to, with the input type's
      // nullability, so the combination of the two must be a subtype of
      // targetType.
      castType = getSubType(targetType);
      // The ref's type must be castable to castType, or we'd not validate. But
      // it can also be a subtype, which will trivially also succeed (so do that
      // more rarely). Pick subtypes rarely, as they make the cast trivial.
      refType = oneIn(5) ? getSubType(castType) : getSuperType(castType);
      if (targetType.isNonNullable()) {
        // And it must have the right nullability for the target, as mentioned
        // above: if the target type is non-nullable then either the ref or the
        // cast types must be.
        if (!refType.isNonNullable() && !castType.isNonNullable()) {
          // Pick one to make non-nullable.
          if (oneIn(2)) {
            refType = Type(refType.getHeapType(), NonNullable);
          } else {
            castType = Type(castType.getHeapType(), NonNullable);
          }
        }
      }
      break;
    }
    case BrOnCastFail: {
      // The sent type is the ref's type, with adjusted nullability (if the cast
      // allows nulls then no null can fail the cast, and what is sent is non-
      // nullable). First, pick a ref type that we can send to the target.
      refType = getSubType(targetType);
      // See above on BrOnCast, but flipped.
      castType = oneIn(5) ? getSuperType(refType) : getSubType(refType);
      // There is no nullability to adjust: if targetType is non-nullable then
      // both refType and castType are as well, as subtypes of it. But we can
      // also allow castType to be nullable (it is not sent to the target).
      if (castType.isNonNullable() && oneIn(2)) {
        castType = Type(castType.getHeapType(), Nullable);
      }
    } break;
    default: {
      WASM_UNREACHABLE("bad br_on op");
    }
  }
  return fixFlowingType(
    builder.makeBrOn(op, targetName, make(refType), castType));
}